

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O1

void __thiscall
gtest_suite_UnsignedToString_::Max<unsigned_long_long>::TestBody(Max<unsigned_long_long> *this)

{
  char *message;
  pair<const_char_*,_const_char_*> pVar1;
  AssertionResult gtest_ar;
  string __str;
  base10storage<TypeParam>_conflict1 out;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  not_null<std::array<char,_20UL>_*> local_38;
  array<char,_20UL> local_2c;
  
  local_38.ptr_ = &local_2c;
  pstore::gsl::not_null<std::array<char,_20UL>_*>::ensure_invariant(&local_38);
  pVar1 = pstore::exchange::export_ns::details::to_characters<unsigned_long_long,_void>
                    (0xffffffffffffffff,local_38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pVar1.first,pVar1.second);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x14');
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_58._M_dataplus._M_p,(uint)local_58._M_string_length,0xffffffffffffffff);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_88,"(std::string{x.first, x.second})","std::to_string (max)",&local_78,&local_58)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x41,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, Max) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    auto const max = std::numeric_limits<TypeParam>::max ();
    std::pair<char const *, char const *> const x = to_characters (max, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), std::to_string (max));
}